

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer.cpp
# Opt level: O3

RPCHelpMan * enumeratesigners(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  undefined1 auVar3 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  RPCHelpMan *in_RDI;
  undefined8 uVar6;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined4 in_stack_fffffffffffff9a8;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffff9ac;
  undefined8 in_stack_fffffffffffff9b8;
  undefined8 in_stack_fffffffffffff9c0;
  undefined8 in_stack_fffffffffffff9c8;
  code *pcVar8;
  undefined8 in_stack_fffffffffffff9d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff9d8;
  pointer in_stack_fffffffffffff9e8;
  pointer pRVar9;
  pointer in_stack_fffffffffffff9f0;
  pointer pRVar10;
  pointer in_stack_fffffffffffff9f8;
  pointer pRVar11;
  undefined8 in_stack_fffffffffffffa00;
  pointer pRVar12;
  pointer pRVar13;
  pointer pRVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffa20;
  pointer in_stack_fffffffffffffa30;
  vector<RPCResult,_std::allocator<RPCResult>_> local_5c0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_5a8;
  RPCResults local_590;
  vector<RPCArg,_std::allocator<RPCArg>_> local_578;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  ulong *local_4a0;
  undefined8 local_498;
  ulong local_490;
  undefined8 uStack_488;
  ulong *local_480;
  size_type local_478;
  ulong local_470;
  undefined8 uStack_468;
  long *local_460 [2];
  long local_450 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_440;
  long *local_420 [2];
  long local_410 [2];
  pointer local_400 [2];
  undefined1 local_3f0 [152];
  RPCResult local_358;
  long *local_2d0 [2];
  long local_2c0 [2];
  long *local_2b0 [2];
  long local_2a0 [2];
  RPCResult local_290;
  long *local_208 [2];
  long local_1f8 [2];
  long *local_1e8 [2];
  long local_1d8 [2];
  RPCResult local_1c8;
  long *local_140 [2];
  long local_130 [2];
  long *local_120 [2];
  long local_110 [2];
  RPCResult local_100;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"enumeratesigners","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"Returns a list of external signers from -signer.","");
  local_120[0] = local_110;
  local_578.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_578.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_578.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"");
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"");
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"signers","");
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"");
  local_2b0[0] = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"");
  local_2d0[0] = local_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"");
  local_400[0] = (pointer)local_3f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"fingerprint","");
  local_420[0] = local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"Master key fingerprint","");
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff9ac;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff9a8;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff9b8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff9c0;
  description._M_string_length = in_stack_fffffffffffff9d0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9c8;
  description.field_2 = in_stack_fffffffffffff9d8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff9f0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff9e8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff9f8;
  RPCResult::RPCResult((RPCResult *)(local_3f0 + 0x10),STR_HEX,m_key_name,description,inner,false);
  local_440.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_440.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"name","");
  local_460[0] = local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_460,"Device name","");
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  pRVar11 = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff9ac;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff9a8;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff9b8;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff9c0;
  description_00._M_string_length = in_stack_fffffffffffff9d0;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9c8;
  description_00.field_2._M_local_buf = in_stack_fffffffffffff9d8._M_local_buf;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_358,STR,m_key_name_00,description_00,inner_00,SUB81(&local_440,0));
  __l._M_len = 2;
  __l._M_array = (iterator)(local_3f0 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffa28,__l,
             (allocator_type *)&stack0xfffffffffffff9e7);
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff9ac;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff9a8;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff9b8;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff9c0;
  description_01._M_string_length = in_stack_fffffffffffff9d0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9c8;
  description_01.field_2._M_local_buf = in_stack_fffffffffffff9d8._M_local_buf;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar10;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar9;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar11;
  RPCResult::RPCResult(&local_290,OBJ,m_key_name_01,description_01,inner_01,SUB81(local_2b0,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_290;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_5c0,__l_00,(allocator_type *)&stack0xfffffffffffff9e6);
  uVar7 = 0;
  auVar3._4_8_ = in_RDI;
  auVar3._0_4_ = in_stack_fffffffffffff9ac;
  auVar3._12_8_ = in_stack_fffffffffffff9b8;
  auVar3._20_8_ = in_stack_fffffffffffff9c0;
  auVar3._28_4_ = 0;
  description_02._M_string_length = in_stack_fffffffffffff9d0;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9c8;
  description_02.field_2._M_local_buf = in_stack_fffffffffffff9d8._M_local_buf;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar10;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar9;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar11;
  RPCResult::RPCResult
            (&local_1c8,ARR,(string)(auVar3 << 0x20),SUB81(local_1e8,0),description_02,inner_02,
             false);
  __l_01._M_len = 1;
  __l_01._M_array = &local_1c8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_5a8,__l_01,(allocator_type *)&stack0xfffffffffffff9e5);
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff9ac;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar7;
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff9b8;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff9c0;
  description_03._M_string_length = in_stack_fffffffffffff9d0;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff9c8;
  description_03.field_2 = in_stack_fffffffffffff9d8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar10;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar9;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar11;
  RPCResult::RPCResult(&local_100,OBJ,m_key_name_02,description_03,inner_03,SUB81(local_120,0));
  result._4_4_ = in_stack_fffffffffffff9ac;
  result.m_type = uVar7;
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result.m_key_name._M_string_length = in_stack_fffffffffffff9b8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff9c0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff9c8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff9d0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff9d8;
  result._64_8_ = pRVar9;
  result.m_description._M_dataplus._M_p = (pointer)pRVar10;
  result.m_description._M_string_length = (size_type)pRVar11;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffffa00;
  result.m_description.field_2._8_8_ = pRVar12;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar13;
  result.m_cond._M_string_length = (size_type)pRVar14;
  result.m_cond.field_2 = in_stack_fffffffffffffa20;
  RPCResults::RPCResults(&local_590,result);
  local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"enumeratesigners","");
  local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"");
  HelpExampleCli(&local_4c0,&local_4e0,&local_500);
  local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"enumeratesigners","");
  local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"");
  HelpExampleRpc(&local_520,&local_540,&local_560);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    uVar6 = local_4c0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_520._M_string_length + local_4c0._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != &local_520.field_2) {
      uVar6 = local_520.field_2._M_allocated_capacity;
    }
    if (local_520._M_string_length + local_4c0._M_string_length <= (ulong)uVar6) {
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_520,0,0,local_4c0._M_dataplus._M_p,local_4c0._M_string_length);
      goto LAB_006b2b83;
    }
  }
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_4c0,local_520._M_dataplus._M_p,local_520._M_string_length);
LAB_006b2b83:
  local_4a0 = &local_490;
  puVar2 = (ulong *)(pbVar4->_M_dataplus)._M_p;
  paVar1 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar1) {
    local_490 = paVar1->_M_allocated_capacity;
    uStack_488 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_490 = paVar1->_M_allocated_capacity;
    local_4a0 = puVar2;
  }
  local_478 = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar4->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_4a0 == &local_490) {
    uStack_468 = uStack_488;
    local_480 = &local_470;
  }
  else {
    local_480 = local_4a0;
  }
  local_470 = local_490;
  local_498 = 0;
  local_490 = local_490 & 0xffffffffffffff00;
  pcVar8 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/external_signer.cpp:43:9)>
           ::_M_manager;
  description_04._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/external_signer.cpp:43:9)>
       ::_M_invoke;
  description_04._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/external_signer.cpp:43:9)>
                ::_M_manager;
  description_04.field_2 = in_stack_fffffffffffff9d8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar10;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar9;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar11;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar12;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa00;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar13;
  examples.m_examples._8_16_ = in_stack_fffffffffffffa20;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar14;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffffa30;
  local_4a0 = &local_490;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff9b8)),description_04,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar8 != (code *)0x0) {
    (*pcVar8)(&stack0xfffffffffffff9b8,&stack0xfffffffffffff9b8,3);
  }
  if (local_480 != &local_470) {
    operator_delete(local_480,local_470 + 1);
  }
  if (local_4a0 != &local_490) {
    operator_delete(local_4a0,local_490 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != &local_520.field_2) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != &local_560.field_2) {
    operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != &local_500.field_2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_590.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_cond._M_dataplus._M_p != &local_100.m_cond.field_2) {
    operator_delete(local_100.m_cond._M_dataplus._M_p,
                    local_100.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_description._M_dataplus._M_p != &local_100.m_description.field_2) {
    operator_delete(local_100.m_description._M_dataplus._M_p,
                    local_100.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_100.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_key_name._M_dataplus._M_p != &local_100.m_key_name.field_2) {
    operator_delete(local_100.m_key_name._M_dataplus._M_p,
                    local_100.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_5a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_cond._M_dataplus._M_p != &local_1c8.m_cond.field_2) {
    operator_delete(local_1c8.m_cond._M_dataplus._M_p,
                    local_1c8.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_description._M_dataplus._M_p != &local_1c8.m_description.field_2) {
    operator_delete(local_1c8.m_description._M_dataplus._M_p,
                    local_1c8.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1c8.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_key_name._M_dataplus._M_p != &local_1c8.m_key_name.field_2) {
    operator_delete(local_1c8.m_key_name._M_dataplus._M_p,
                    local_1c8.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_5c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290.m_cond._M_dataplus._M_p != &local_290.m_cond.field_2) {
    operator_delete(local_290.m_cond._M_dataplus._M_p,
                    local_290.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290.m_description._M_dataplus._M_p != &local_290.m_description.field_2) {
    operator_delete(local_290.m_description._M_dataplus._M_p,
                    local_290.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_290.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290.m_key_name._M_dataplus._M_p != &local_290.m_key_name.field_2) {
    operator_delete(local_290.m_key_name._M_dataplus._M_p,
                    local_290.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffa28);
  lVar5 = 0x110;
  do {
    if ((long *)(local_3f0 + lVar5) != *(long **)((long)local_400 + lVar5)) {
      operator_delete(*(long **)((long)local_400 + lVar5),*(long *)(local_3f0 + lVar5) + 1);
    }
    if ((long *)((long)local_410 + lVar5) != *(long **)((long)local_420 + lVar5)) {
      operator_delete(*(long **)((long)local_420 + lVar5),*(long *)((long)local_410 + lVar5) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_440.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar5));
    if ((long *)((long)local_450 + lVar5) != *(long **)((long)local_460 + lVar5)) {
      operator_delete(*(long **)((long)local_460 + lVar5),*(long *)((long)local_450 + lVar5) + 1);
    }
    lVar5 = lVar5 + -0x88;
  } while (lVar5 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff9e8);
  if (local_460[0] != local_450) {
    operator_delete(local_460[0],local_450[0] + 1);
  }
  if (local_440.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_440.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_440.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_440.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffa08);
  if (local_420[0] != local_410) {
    operator_delete(local_420[0],local_410[0] + 1);
  }
  if (local_400[0] != (pointer)local_3f0) {
    operator_delete(local_400[0],local_3f0._0_8_ + 1);
  }
  if (local_2d0[0] != local_2c0) {
    operator_delete(local_2d0[0],local_2c0[0] + 1);
  }
  if (local_2b0[0] != local_2a0) {
    operator_delete(local_2b0[0],local_2a0[0] + 1);
  }
  if (local_208[0] != local_1f8) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_578);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan enumeratesigners()
{
    return RPCHelpMan{"enumeratesigners",
        "Returns a list of external signers from -signer.",
        {},
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::ARR, "signers", /*optional=*/false, "",
                {
                    {RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR_HEX, "fingerprint", "Master key fingerprint"},
                        {RPCResult::Type::STR, "name", "Device name"},
                    }},
                },
                }
            }
        },
        RPCExamples{
            HelpExampleCli("enumeratesigners", "")
            + HelpExampleRpc("enumeratesigners", "")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            const std::string command = gArgs.GetArg("-signer", "");
            if (command == "") throw JSONRPCError(RPC_MISC_ERROR, "Error: restart bitcoind with -signer=<cmd>");
            const std::string chain = gArgs.GetChainTypeString();
            UniValue signers_res = UniValue::VARR;
            try {
                std::vector<ExternalSigner> signers;
                ExternalSigner::Enumerate(command, signers, chain);
                for (const ExternalSigner& signer : signers) {
                    UniValue signer_res = UniValue::VOBJ;
                    signer_res.pushKV("fingerprint", signer.m_fingerprint);
                    signer_res.pushKV("name", signer.m_name);
                    signers_res.push_back(std::move(signer_res));
                }
            } catch (const std::exception& e) {
                throw JSONRPCError(RPC_MISC_ERROR, e.what());
            }
            UniValue result(UniValue::VOBJ);
            result.pushKV("signers", std::move(signers_res));
            return result;
        }
    };
}